

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

Vec_Ptr_t * Gia_VtaAbsToFrames(Vec_Int_t *vAbs)

{
  int nCap;
  int iVar1;
  int i;
  int Entry;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  int iVar2;
  
  nCap = Vec_IntEntry(vAbs,0);
  iVar1 = Vec_IntEntry(vAbs,nCap + 1);
  if (iVar1 != vAbs->nSize) {
    __assert_fail("Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                  ,0x9a,"Vec_Ptr_t *Gia_VtaAbsToFrames(Vec_Int_t *)");
  }
  p = Vec_PtrAlloc(nCap);
  if (nCap < 1) {
    nCap = 0;
  }
  iVar1 = -1;
  iVar2 = 0;
  while (iVar2 != nCap) {
    i = Vec_IntEntry(vAbs,iVar2 + 1);
    iVar1 = Vec_IntEntry(vAbs,iVar2 + 2);
    p_00 = Vec_IntAlloc(iVar1 - i);
    for (; i < iVar1; i = i + 1) {
      Entry = Vec_IntEntry(vAbs,i);
      Vec_IntPush(p_00,Entry);
    }
    Vec_PtrPush(p,p_00);
    iVar2 = iVar2 + 1;
  }
  if (iVar1 == vAbs->nSize) {
    return p;
  }
  __assert_fail("iStop == Vec_IntSize(vAbs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                ,0xa5,"Vec_Ptr_t *Gia_VtaAbsToFrames(Vec_Int_t *)");
}

Assistant:

Vec_Ptr_t * Gia_VtaAbsToFrames( Vec_Int_t * vAbs )
{
    Vec_Ptr_t * vFrames;
    Vec_Int_t * vFrame;
    int i, k, Entry, iStart, iStop = -1;
    int nFrames = Vec_IntEntry( vAbs, 0 );
    assert( Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs) );
    vFrames = Vec_PtrAlloc( nFrames );
    for ( i = 0; i < nFrames; i++ )
    {
        iStart = Vec_IntEntry( vAbs, i+1 );
        iStop  = Vec_IntEntry( vAbs, i+2 );
        vFrame = Vec_IntAlloc( iStop - iStart );
        Vec_IntForEachEntryStartStop( vAbs, Entry, k, iStart, iStop )
            Vec_IntPush( vFrame, Entry );
        Vec_PtrPush( vFrames, vFrame );
    }
    assert( iStop == Vec_IntSize(vAbs) );
    return vFrames;
}